

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::Keyboard::
reset_all_keys(Keyboard *this)

{
  this->key_is_down_ = false;
  this->open_apple_is_pressed = false;
  this->closed_apple_is_pressed = false;
  this->character_is_pressed_ = false;
  this->repeat_is_pressed_ = false;
  this->shift_is_pressed_ = false;
  this->control_is_pressed_ = false;
  return;
}

Assistant:

void reset_all_keys() final {
				open_apple_is_pressed =
				closed_apple_is_pressed =
				control_is_pressed_ =
				shift_is_pressed_ =
				repeat_is_pressed_ =
				key_is_down_ =
				character_is_pressed_ = false;
			}